

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_foreach_event_(event_base *base,event_base_foreach_event_cb fn,void *arg)

{
  int iVar1;
  evmap_foreach_event_helper h;
  event_base_foreach_event_cb local_18;
  void *local_10;
  
  local_18 = fn;
  local_10 = arg;
  iVar1 = evmap_io_foreach_fd(base,evmap_io_foreach_event_fn,&local_18);
  if (iVar1 == 0) {
    iVar1 = evmap_signal_foreach_signal(base,evmap_signal_foreach_event_fn,&local_18);
  }
  return iVar1;
}

Assistant:

int
evmap_foreach_event_(struct event_base *base,
    event_base_foreach_event_cb fn, void *arg)
{
	struct evmap_foreach_event_helper h;
	int r;
	h.fn = fn;
	h.arg = arg;
	if ((r = evmap_io_foreach_fd(base, evmap_io_foreach_event_fn, &h)))
		return r;
	return evmap_signal_foreach_signal(base, evmap_signal_foreach_event_fn, &h);
}